

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  char cVar2;
  basic_format_specs<char> *pbVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  size_type sVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  string groups;
  format_specs local_f8;
  ulong local_e0;
  string local_d8;
  ulong local_b8;
  ulong uStack_b0;
  undefined4 local_a8;
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::num_writer>
  local_98;
  
  grouping_impl<char>(&local_d8,(locale_ref)(this->writer->locale_).locale_);
  if (local_d8._M_string_length == 0) {
    on_dec(this);
  }
  else {
    pbVar3 = this->specs;
    cVar1 = pbVar3->thousands;
    if (cVar1 == '\0') {
      on_dec(this);
    }
    else {
      uVar4 = (ulong)this->abs_value;
      local_e0 = *(ulong *)((long)&this->abs_value + 8);
      auVar14 = (undefined1  [16])this->abs_value;
      iVar11 = 1;
      if ((uVar4 < 10) <= local_e0) {
        iVar6 = 4;
        do {
          iVar11 = iVar6;
          uVar9 = auVar14._8_8_;
          uVar12 = auVar14._0_8_;
          if (uVar9 == 0 && (ulong)(99 < uVar12) <= -uVar9) {
            iVar11 = iVar11 + -2;
            goto LAB_012650b9;
          }
          if (uVar9 == 0 && (ulong)(999 < uVar12) <= -uVar9) {
            iVar11 = iVar11 + -1;
            goto LAB_012650b9;
          }
          if (uVar9 < (uVar12 < 10000)) goto LAB_012650b9;
          auVar14 = __udivti3(uVar12,uVar9,10000,0);
          iVar6 = iVar11 + 4;
        } while (uVar9 != 0 || -uVar9 < (ulong)(99999 < uVar12));
        iVar11 = iVar11 + 1;
      }
LAB_012650b9:
      local_98.f.groups = &local_d8;
      local_98.f.size = iVar11 + (int)local_d8._M_string_length;
      sVar8 = 0;
      iVar6 = iVar11;
      do {
        cVar2 = local_d8._M_dataplus._M_p[sVar8];
        iVar10 = iVar6 - cVar2;
        if ((iVar10 == 0 || iVar6 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) {
          local_98.f.size = iVar11 + (int)sVar8;
          iVar10 = iVar6;
          if (local_d8._M_string_length != sVar8) goto LAB_01265111;
          break;
        }
        sVar8 = sVar8 + 1;
        iVar6 = iVar10;
      } while (local_d8._M_string_length != sVar8);
      local_98.f.size =
           (iVar10 + -1) / (int)local_d8._M_dataplus._M_p[local_d8._M_string_length - 1] +
           local_98.f.size;
LAB_01265111:
      local_98.prefix.size_ = (size_t)this->prefix_size;
      local_98.prefix.data_ = this->prefix;
      local_f8.thousands = pbVar3->thousands;
      local_f8._17_3_ = *(undefined3 *)&pbVar3->field_0x11;
      local_f8.width = pbVar3->width;
      local_f8.precision = pbVar3->precision;
      uStack_b0._0_1_ = pbVar3->type;
      uStack_b0._1_1_ = pbVar3->field_0x9;
      uStack_b0._2_6_ = pbVar3->fill;
      uVar9 = (uint)local_98.f.size + local_98.prefix.size_;
      local_f8.fill.data_[0] = (char)uStack_b0._2_6_;
      local_98.fill = local_f8.fill.data_[0];
      uVar12 = uStack_b0;
      if ((uStack_b0._1_1_ & 0xf) == 4) {
        uVar7 = local_f8._0_8_ & 0xffffffff;
        local_98.size_ = uVar9;
        local_98.padding = 0;
        if (uVar9 <= uVar7) {
          local_98.size_ = uVar7;
          local_98.padding = uVar7 - uVar9;
        }
      }
      else {
        bVar13 = local_f8.precision - local_98.f.size == 0;
        local_98.fill = '0';
        if (bVar13 || (int)local_f8.precision < local_98.f.size) {
          local_98.fill = local_f8.fill.data_[0];
        }
        uVar5 = local_f8.precision - local_98.f.size;
        if (bVar13 || (int)local_f8.precision < local_98.f.size) {
          uVar5 = 0;
        }
        if (!bVar13 && local_98.f.size <= (int)local_f8.precision) {
          uVar9 = (uint)local_f8.precision + local_98.prefix.size_;
        }
        local_98.size_ = uVar9;
        local_98.padding = (ulong)uVar5;
        if ((uStack_b0 & 0xf00) == 0) {
          local_f8._8_8_ = uStack_b0 | 0x200;
          uVar12 = local_f8._8_8_;
        }
      }
      local_f8._8_8_ = uVar12;
      local_98.f.abs_value._8_8_ = local_e0;
      local_b8 = local_f8._0_8_;
      local_a8 = local_f8._16_4_;
      local_98.f.abs_value._0_8_ = uVar4;
      local_98.f.sep = cVar1;
      basic_writer<duckdb_fmt::v6::buffer_range<char>>::
      write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<__int128,duckdb_fmt::v6::basic_format_specs<char>>::num_writer>>
                ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this->writer,&local_f8,
                 &local_98);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }